

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_1::FillRuleCase::iterate(FillRuleCase *this)

{
  size_type *psVar1;
  FillRuleCaseType FVar2;
  uint uVar3;
  TestLog *pTVar4;
  int i;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  RenderTarget *pRVar8;
  long lVar9;
  ulong uVar10;
  pointer pVVar11;
  undefined4 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong *puVar13;
  long lVar14;
  Surface *pSVar15;
  void *__buf;
  void *__buf_00;
  char *description;
  int row;
  int iVar16;
  ulong uVar17;
  IterateResult IVar18;
  undefined8 uVar19;
  bool bVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Vec2 sideH;
  Vec2 sideV;
  Vec2 center;
  Vector<float,_2> res_4;
  Vector<float,_2> res_3;
  Random rnd;
  Vector<float,_2> res_1;
  Surface resultImage;
  string iterationDescription;
  ScopedLogSection section;
  Vector<float,_2> res_5;
  Vec2 quad [4];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_318;
  string local_2f8;
  string local_2d8;
  undefined1 local_2b8 [8];
  size_type local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  float local_294;
  float local_290 [5];
  int local_27c;
  int local_278;
  int local_274;
  LogImageSet local_270;
  ulong local_230;
  string local_228;
  Surface local_208;
  float local_1ec;
  string local_1e8;
  ScopedLogSection local_1c8;
  float local_1c0 [2];
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [4];
  ios_base local_148 [8];
  ios_base local_140 [264];
  long local_38;
  
  iVar5 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<((ostringstream *)local_1b8,iVar5 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,0x657f50);
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar12) {
    local_2a8._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_2a8._8_8_ = plVar6[3];
    local_2b8 = (undefined1  [8])&local_2a8;
  }
  else {
    local_2a8._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_2b8 = (undefined1  [8])*plVar6;
  }
  local_2b0 = plVar6[1];
  *plVar6 = (long)paVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_2b8);
  paVar12 = &local_270.m_name.field_2;
  puVar13 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_270.m_name.field_2._M_allocated_capacity = *puVar13;
    local_270.m_name.field_2._8_8_ = plVar6[3];
    local_270.m_name._M_dataplus._M_p = (pointer)paVar12;
  }
  else {
    local_270.m_name.field_2._M_allocated_capacity = *puVar13;
    local_270.m_name._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_270.m_name._M_string_length = plVar6[1];
  *plVar6 = (long)puVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.m_name._M_dataplus._M_p != paVar12) {
    uVar19 = local_270.m_name.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_270.m_name._M_string_length + local_2d8._M_string_length) {
    uVar19 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      uVar19 = local_2d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < local_270.m_name._M_string_length + local_2d8._M_string_length)
    goto LAB_003643e9;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_2d8,0,(char *)0x0,(ulong)local_270.m_name._M_dataplus._M_p);
  }
  else {
LAB_003643e9:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_2d8._M_dataplus._M_p);
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  psVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1e8.field_2._M_allocated_capacity = *psVar1;
    local_1e8.field_2._8_8_ = puVar7[3];
  }
  else {
    local_1e8.field_2._M_allocated_capacity = *psVar1;
    local_1e8._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_1e8._M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.m_name._M_dataplus._M_p != paVar12) {
    operator_delete(local_270.m_name._M_dataplus._M_p,
                    local_270.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_2b8 != (undefined1  [8])&local_2a8) {
    operator_delete((void *)local_2b8,local_2a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  tcu::ScopedLogSection::ScopedLogSection
            (&local_1c8,
             ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log,&local_1e8,&local_1e8);
  pRVar8 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  iVar23 = 1 << (8U - (char)(pRVar8->m_pixelFormat).redBits & 0x1f);
  pRVar8 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  iVar16 = 1 << (8U - (char)(pRVar8->m_pixelFormat).greenBits & 0x1f);
  pRVar8 = Context::getRenderTarget((this->super_BaseRenderingCase).super_TestCase.m_context);
  local_278 = 1 << (8U - (char)(pRVar8->m_pixelFormat).blueBits & 0x1f);
  iVar5 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&local_208,iVar5,iVar5);
  local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FVar2 = this->m_caseType;
  local_27c = iVar16;
  local_274 = iVar23;
  if (FVar2 < FILLRULECASE_LAST) {
    local_230 = (ulong)(uint)this->m_iteration;
    if ((0x13U >> (FVar2 & 0x1f) & 1) == 0) {
      local_270.m_name._M_dataplus._M_p._4_4_ = 0x3f000000;
      if (FVar2 != FILLRULECASE_CLIPPED_PARTIAL) {
        local_270.m_name._M_dataplus._M_p._4_4_ = 0;
      }
      fVar24 = *(float *)(&DAT_00657814 + (ulong)(FVar2 == FILLRULECASE_CLIPPED_PARTIAL) * 4);
      local_270.m_name._M_dataplus._M_p._0_4_ = local_270.m_name._M_dataplus._M_p._4_4_;
      local_294 = ((float)this->m_iteration / (float)(this->m_iterationCount + -1)) * 3.1415927 *
                  0.5;
      fVar25 = cosf(local_294);
      local_1b8._4_4_ = sinf(local_294);
      local_1b8._0_4_ = fVar25;
      local_2b8 = (undefined1  [8])0x0;
      lVar14 = 0;
      do {
        *(float *)(local_2b8 + lVar14 * 4) = *(float *)(local_1b8 + lVar14 * 4) * fVar24;
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      local_2f8._M_dataplus._M_p =
           (pointer)(CONCAT44(local_2b8._0_4_,local_2b8._4_4_) ^ 0x8000000000000000);
      local_2d8._M_dataplus._M_p = (pointer)0x0;
      lVar14 = 0;
      do {
        *(float *)((long)&local_2d8._M_dataplus._M_p + lVar14 * 4) =
             *(float *)((long)&local_270.m_name._M_dataplus._M_p + lVar14 * 4) +
             *(float *)(local_2b8 + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      local_1b8 = (undefined1  [8])0x0;
      lVar14 = 0;
      do {
        *(float *)(local_1b8 + lVar14 * 4) =
             *(float *)((long)&local_2d8._M_dataplus._M_p + lVar14 * 4) +
             *(float *)((long)&local_2f8._M_dataplus._M_p + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      local_228._M_dataplus._M_p = (pointer)0x0;
      lVar14 = 0;
      do {
        *(float *)((long)&local_228._M_dataplus._M_p + lVar14 * 4) =
             *(float *)((long)&local_270.m_name._M_dataplus._M_p + lVar14 * 4) +
             *(float *)(local_2b8 + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      uStack_1b0 = 0;
      lVar14 = 0;
      do {
        *(float *)((long)&uStack_1b0 + lVar14 * 4) =
             *(float *)((long)&local_228._M_dataplus._M_p + lVar14 * 4) -
             *(float *)((long)&local_2f8._M_dataplus._M_p + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      local_290[2] = 0.0;
      local_290[3] = 0.0;
      lVar14 = 0;
      do {
        local_290[lVar14 + 2] =
             *(float *)((long)&local_270.m_name._M_dataplus._M_p + lVar14 * 4) -
             *(float *)(local_2b8 + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      local_1a8._0_8_ = 0;
      lVar14 = 0;
      do {
        *(float *)(local_1a8 + lVar14 * 4) =
             local_290[lVar14 + 2] - *(float *)((long)&local_2f8._M_dataplus._M_p + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      local_290[0] = 0.0;
      local_290[1] = 0.0;
      lVar14 = 0;
      do {
        local_290[lVar14] =
             *(float *)((long)&local_270.m_name._M_dataplus._M_p + lVar14 * 4) -
             *(float *)(local_2b8 + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      local_1a8._8_8_ = 0;
      lVar14 = 0;
      do {
        *(float *)(local_1a8 + lVar14 * 4 + 8) =
             local_290[lVar14] + *(float *)((long)&local_2f8._M_dataplus._M_p + lVar14 * 4);
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&local_318,6);
      (local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[0] = (float)local_1b8._0_4_;
      (local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[1] = (float)local_1b8._4_4_;
      (local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[2] = 0.0;
      (local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[3] = 1.0;
      *(size_type *)
       local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start[1].m_data = uStack_1b0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[2] = 0.0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[3] = 1.0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[0] = (float)local_1a8._0_4_;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[1] = (float)local_1a8._4_4_;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[2] = 0.0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[3] = 1.0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[0] = (float)local_1a8._0_4_;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[1] = (float)local_1a8._4_4_;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[2] = 0.0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[3] = 1.0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[0] = (float)local_1b8._0_4_;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[1] = (float)local_1b8._4_4_;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[2] = 0.0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[3] = 1.0;
      *(undefined8 *)
       local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start[5].m_data = local_1a8._8_8_;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[2] = 0.0;
      local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[3] = 1.0;
    }
    else {
      deRandom_init((deRandom *)&local_270,0xabcd);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&local_318,0x60);
      local_230 = (ulong)(uint)((int)local_230 << 4);
      lVar14 = 0;
      do {
        fVar24 = ((float)(int)lVar14 + 0.5) * 0.25;
        local_294 = fVar24 + fVar24 + -1.0;
        uVar21 = lVar14 * 4;
        iVar5 = (int)local_230;
        uVar17 = 0;
        local_38 = lVar14;
        do {
          fVar24 = ((float)(int)uVar17 + 0.5) * 0.25;
          local_2b8._4_4_ = local_294;
          local_2b8._0_4_ = fVar24 + fVar24 + -1.0;
          fVar24 = ((float)(iVar5 + (int)lVar14 * 4 + (int)uVar17) /
                   (float)(this->m_iterationCount << 4)) * 3.1415927 * 0.5;
          fVar25 = cosf(fVar24);
          local_1b8._4_4_ = sinf(fVar24);
          local_1b8._0_4_ = fVar25;
          local_2f8._M_dataplus._M_p = (pointer)0x0;
          lVar9 = 0;
          do {
            *(float *)((long)&local_2f8._M_dataplus._M_p + lVar9 * 4) =
                 *(float *)(local_1b8 + lVar9 * 4) * 0.15;
            lVar9 = lVar9 + 1;
          } while (lVar9 == 1);
          local_2d8._M_dataplus._M_p =
               (pointer)(CONCAT44(local_2f8._M_dataplus._M_p._0_4_,local_2f8._M_dataplus._M_p._4_4_)
                        ^ 0x8000000000000000);
          local_228._M_dataplus._M_p = (pointer)0x0;
          lVar9 = 0;
          do {
            *(float *)((long)&local_228._M_dataplus._M_p + lVar9 * 4) =
                 *(float *)(local_2b8 + lVar9 * 4) +
                 *(float *)((long)&local_2f8._M_dataplus._M_p + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 == 1);
          local_1b8 = (undefined1  [8])0x0;
          lVar9 = 0;
          do {
            *(float *)(local_1b8 + lVar9 * 4) =
                 *(float *)((long)&local_228._M_dataplus._M_p + lVar9 * 4) +
                 *(float *)((long)&local_2d8._M_dataplus._M_p + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 == 1);
          local_290[2] = 0.0;
          local_290[3] = 0.0;
          lVar9 = 0;
          do {
            local_290[lVar9 + 2] =
                 *(float *)(local_2b8 + lVar9 * 4) +
                 *(float *)((long)&local_2f8._M_dataplus._M_p + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 == 1);
          uStack_1b0 = 0;
          lVar9 = 0;
          do {
            *(float *)((long)&uStack_1b0 + lVar9 * 4) =
                 local_290[lVar9 + 2] - *(float *)((long)&local_2d8._M_dataplus._M_p + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 == 1);
          local_290[0] = 0.0;
          local_290[1] = 0.0;
          lVar9 = 0;
          do {
            local_290[lVar9] =
                 *(float *)(local_2b8 + lVar9 * 4) -
                 *(float *)((long)&local_2f8._M_dataplus._M_p + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 == 1);
          local_1a8._0_8_ = 0;
          lVar9 = 0;
          do {
            *(float *)(local_1a8 + lVar9 * 4) =
                 local_290[lVar9] - *(float *)((long)&local_2d8._M_dataplus._M_p + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 == 1);
          local_1c0[0] = 0.0;
          local_1c0[1] = 0.0;
          lVar9 = 0;
          do {
            local_1c0[lVar9] =
                 *(float *)(local_2b8 + lVar9 * 4) -
                 *(float *)((long)&local_2f8._M_dataplus._M_p + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 == 1);
          local_1a8._8_8_ = 0;
          lVar9 = 0;
          do {
            *(float *)(local_1a8 + lVar9 * 4 + 8) =
                 local_1c0[lVar9] + *(float *)((long)&local_2d8._M_dataplus._M_p + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 == 1);
          FVar2 = this->m_caseType;
          if (FVar2 == FILLRULECASE_PROJECTED) {
            fVar24 = deRandom_getFloat((deRandom *)&local_270);
            fVar24 = fVar24 * 3.9 + 0.1;
            fVar25 = deRandom_getFloat((deRandom *)&local_270);
            local_1ec = fVar25 * 3.9 + 0.1;
            fVar25 = deRandom_getFloat((deRandom *)&local_270);
            fVar26 = deRandom_getFloat((deRandom *)&local_270);
            fVar25 = fVar25 * 3.9 + 0.1;
            fVar26 = fVar26 * 3.9 + 0.1;
            uVar10 = uVar17 | uVar21;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6].m_data[0] =
                 (float)local_1b8._0_4_ * fVar24;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6].m_data[1] =
                 (float)local_1b8._4_4_ * fVar24;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6].m_data[2] = 0.0;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6].m_data[3] = fVar24;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 1].m_data[0] =
                 (float)uStack_1b0 * local_1ec;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 1].m_data[1] =
                 uStack_1b0._4_4_ * local_1ec;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 1].m_data[2] = 0.0;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 1].m_data[3] = local_1ec;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 2].m_data[0] =
                 (float)local_1a8._0_4_ * fVar25;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 2].m_data[1] =
                 (float)local_1a8._4_4_ * fVar25;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 2].m_data[2] = 0.0;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 2].m_data[3] = fVar25;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 3].m_data[0] =
                 (float)local_1a8._0_4_ * fVar25;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 3].m_data[1] =
                 (float)local_1a8._4_4_ * fVar25;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 3].m_data[2] = 0.0;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 3].m_data[3] = fVar25;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 4].m_data[0] =
                 (float)local_1b8._0_4_ * fVar24;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 4].m_data[1] =
                 (float)local_1b8._4_4_ * fVar24;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 4].m_data[2] = 0.0;
            local_318.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 4].m_data[3] = fVar24;
            fVar24 = (float)local_1a8._8_4_ * fVar26;
            fVar25 = (float)local_1a8._12_4_ * fVar26;
            pVVar11 = local_318.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar10 * 6;
LAB_00364b9b:
            pVVar11[5].m_data[0] = fVar24;
            pVVar11[5].m_data[1] = fVar25;
            pVVar11[5].m_data[2] = 0.0;
            pVVar11[5].m_data[3] = fVar26;
          }
          else {
            if (FVar2 == FILLRULECASE_REVERSED) {
              uVar10 = uVar17 | uVar21;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6].m_data[0] =
                   (float)local_1b8._0_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6].m_data[1] =
                   (float)local_1b8._4_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6].m_data[2] = 0.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6].m_data[3] = 1.0;
              *(size_type *)
               local_318.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 1].m_data = uStack_1b0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 1].m_data[2] = 0.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 1].m_data[3] = 1.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 2].m_data[0] =
                   (float)local_1a8._0_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 2].m_data[1] =
                   (float)local_1a8._4_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 2].m_data[2] = 0.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 2].m_data[3] = 1.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 3].m_data[0] =
                   (float)local_1b8._0_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 3].m_data[1] =
                   (float)local_1b8._4_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 3].m_data[2] = 0.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 3].m_data[3] = 1.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 4].m_data[0] =
                   (float)local_1a8._0_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 4].m_data[1] =
                   (float)local_1a8._4_4_;
LAB_003649e5:
              (local_318.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + 4)[(uVar17 | uVar21) * 6].m_data[2] = 0.0;
              (local_318.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + 4)[(uVar17 | uVar21) * 6].m_data[3] = 1.0;
              pVVar11 = local_318.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (uVar17 | uVar21) * 6;
              fVar26 = 1.0;
              fVar24 = (float)local_1a8._8_4_;
              fVar25 = (float)local_1a8._12_4_;
              goto LAB_00364b9b;
            }
            if (FVar2 == FILLRULECASE_BASIC) {
              uVar10 = uVar17 | uVar21;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6].m_data[0] =
                   (float)local_1b8._0_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6].m_data[1] =
                   (float)local_1b8._4_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6].m_data[2] = 0.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6].m_data[3] = 1.0;
              *(size_type *)
               local_318.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 1].m_data = uStack_1b0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 1].m_data[2] = 0.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 1].m_data[3] = 1.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 2].m_data[0] =
                   (float)local_1a8._0_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 2].m_data[1] =
                   (float)local_1a8._4_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 2].m_data[2] = 0.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 2].m_data[3] = 1.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 3].m_data[0] =
                   (float)local_1a8._0_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 3].m_data[1] =
                   (float)local_1a8._4_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 3].m_data[2] = 0.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 3].m_data[3] = 1.0;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 4].m_data[0] =
                   (float)local_1b8._0_4_;
              local_318.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10 * 6 + 4].m_data[1] =
                   (float)local_1b8._4_4_;
              goto LAB_003649e5;
            }
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != 4);
        lVar14 = local_38 + 1;
      } while (lVar14 != 4);
    }
  }
  iVar5 = (*((this->super_BaseRenderingCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var,iVar5);
  local_1b8 = (undefined1  [8])0x3f0000003f000000;
  uStack_1b0 = 0x3f8000003f000000;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_270,
             (long)local_318.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_318.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(value_type *)local_1b8,
             (allocator_type *)local_2b8);
  local_1b8 = (undefined1  [8])
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_1b0,
             "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments."
             ,0x65);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
  std::ios_base::~ios_base(local_140);
  (**(code **)(lVar14 + 0x5e0))(0xbe2);
  (**(code **)(lVar14 + 0x100))(0x8006);
  (**(code **)(lVar14 + 0x120))(1,1);
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,&local_208,&local_318,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_270,4)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.m_name._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_270.m_name._M_dataplus._M_p,
                    local_270.m_name.field_2._M_allocated_capacity -
                    (long)local_270.m_name._M_dataplus._M_p);
  }
  local_1b8 = (undefined1  [8])
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_1b0,"Verifying result.",0x11);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
  std::ios_base::~ios_base(local_140);
  iVar16 = 0;
  iVar5 = iVar16;
  if (0 < local_208.m_height) {
    iVar23 = 0;
    iVar5 = 0;
    do {
      uVar21 = (ulong)(uint)local_208.m_width;
      iVar22 = iVar16;
      if (0 < local_208.m_width) {
        do {
          uVar3 = *(uint *)((long)local_208.m_pixels.m_ptr + (long)iVar22 * 4);
          if (((local_274 < (int)((uVar3 & 0xff) - 0x7f)) ||
              (local_27c < (int)((uVar3 >> 8 & 0xff) - 0x7f))) ||
             (local_278 < (int)((uVar3 >> 0x10 & 0xff) - 0x7f))) {
            iVar5 = 1;
          }
          iVar22 = iVar22 + 1;
          uVar21 = uVar21 - 1;
        } while (uVar21 != 0);
      }
      iVar23 = iVar23 + 1;
      iVar16 = iVar16 + local_208.m_width;
    } while (iVar23 != local_208.m_height);
  }
  if (iVar5 == 0) {
    local_1b8 = (undefined1  [8])
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1b0,"No overlapping fragments detected.",0x22);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
    std::ios_base::~ios_base(local_140);
  }
  else {
    local_1b8 = (undefined1  [8])
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1b0,"Overlapping fragments detected, image is not valid.",0x33);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
    std::ios_base::~ios_base(local_140);
    pTVar4 = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log;
    local_2b8 = (undefined1  [8])&local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"Result of rendering","");
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Result of rendering","");
    tcu::LogImageSet::LogImageSet(&local_270,(string *)local_2b8,&local_2f8);
    tcu::TestLog::startImageSet
              (pTVar4,local_270.m_name._M_dataplus._M_p,local_270.m_description._M_dataplus._M_p);
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Result","");
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Result","");
    pSVar15 = &local_208;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b8,&local_2d8,&local_228,pSVar15,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b8,(int)pTVar4,__buf,(size_t)pSVar15);
    tcu::TestLog::endImageSet(pTVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])local_1a8) {
      operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.m_description._M_dataplus._M_p != &local_270.m_description.field_2) {
      operator_delete(local_270.m_description._M_dataplus._M_p,
                      local_270.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.m_name._M_dataplus._M_p != &local_270.m_name.field_2) {
      operator_delete(local_270.m_name._M_dataplus._M_p,
                      local_270.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_2b8 != (undefined1  [8])&local_2a8) {
      operator_delete((void *)local_2b8,local_2a8._M_allocated_capacity + 1);
    }
    this->m_allIterationsPassed = false;
  }
  if (this->m_caseType == FILLRULECASE_CLIPPED_FULL) {
    local_1b8 = (undefined1  [8])
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1b0,"Searching missing fragments.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
    std::ios_base::~ios_base(local_140);
    if (0 < local_208.m_height) {
      iVar16 = 0;
      iVar23 = 0;
      bVar20 = false;
      do {
        uVar21 = (ulong)(uint)local_208.m_width;
        iVar22 = iVar16;
        if (0 < local_208.m_width) {
          do {
            uVar3 = *(uint *)((long)local_208.m_pixels.m_ptr + (long)iVar22 * 4);
            if ((((int)(uVar3 & 0xff) <= local_274) || ((int)(uVar3 >> 8 & 0xff) <= local_27c)) ||
               ((int)(uVar3 >> 0x10 & 0xff) <= local_278)) {
              bVar20 = true;
            }
            iVar22 = iVar22 + 1;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        iVar23 = iVar23 + 1;
        iVar16 = iVar16 + local_208.m_width;
      } while (iVar23 != local_208.m_height);
      if (bVar20) {
        local_1b8 = (undefined1  [8])
                    ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                    m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&uStack_1b0,"Missing fragments detected, image is not valid.",0x2f);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
        std::ios_base::~ios_base(local_140);
        if (iVar5 == 0) {
          pTVar4 = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx)->m_log;
          local_2b8 = (undefined1  [8])&local_2a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2b8,"Result of rendering","");
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2f8,"Result of rendering","");
          tcu::LogImageSet::LogImageSet(&local_270,(string *)local_2b8,&local_2f8);
          tcu::TestLog::startImageSet
                    (pTVar4,local_270.m_name._M_dataplus._M_p,
                     local_270.m_description._M_dataplus._M_p);
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Result","");
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Result","");
          pSVar15 = &local_208;
          tcu::LogImage::LogImage
                    ((LogImage *)local_1b8,&local_2d8,&local_228,pSVar15,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_1b8,(int)pTVar4,__buf_00,(size_t)pSVar15);
          tcu::TestLog::endImageSet(pTVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_p != local_188) {
            operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
          }
          if (local_1b8 != (undefined1  [8])local_1a8) {
            operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270.m_description._M_dataplus._M_p != &local_270.m_description.field_2) {
            operator_delete(local_270.m_description._M_dataplus._M_p,
                            local_270.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270.m_name._M_dataplus._M_p != &local_270.m_name.field_2) {
            operator_delete(local_270.m_name._M_dataplus._M_p,
                            local_270.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          if (local_2b8 != (undefined1  [8])&local_2a8) {
            operator_delete((void *)local_2b8,local_2a8._M_allocated_capacity + 1);
          }
        }
        this->m_allIterationsPassed = false;
        goto LAB_0036576e;
      }
    }
    local_1b8 = (undefined1  [8])
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1b0,"No missing fragments detected.",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
    std::ios_base::~ios_base(local_140);
  }
LAB_0036576e:
  iVar5 = this->m_iteration + 1;
  this->m_iteration = iVar5;
  IVar18 = CONTINUE;
  if (iVar5 == this->m_iterationCount) {
    description = "Found invalid pixels";
    if (this->m_allIterationsPassed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    IVar18 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,this->m_allIterationsPassed ^ QP_TEST_RESULT_FAIL,description);
  }
  if (local_318.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_318.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_318.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_208);
  tcu::TestLog::endSection(local_1c8.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return IVar18;
}

Assistant:

FillRuleCase::IterateResult FillRuleCase::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	const int								thresholdRed			= 1 << (8 - m_context.getRenderTarget().getPixelFormat().redBits);
	const int								thresholdGreen			= 1 << (8 - m_context.getRenderTarget().getPixelFormat().greenBits);
	const int								thresholdBlue			= 1 << (8 - m_context.getRenderTarget().getPixelFormat().blueBits);
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	bool									imageShown				= false;

	generateTriangles(m_iteration, drawBuffer);

	// draw image
	{
		const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
		const std::vector<tcu::Vec4>	colorBuffer		(drawBuffer.size(), tcu::Vec4(0.5f, 0.5f, 0.5f, 1.0f));

		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments." << tcu::TestLog::EndMessage;

		gl.enable(GL_BLEND);
		gl.blendEquation(GL_FUNC_ADD);
		gl.blendFunc(GL_ONE, GL_ONE);
		drawPrimitives(resultImage, drawBuffer, colorBuffer, GL_TRIANGLES);
	}

	// verify no overdraw
	{
		const tcu::RGBA	triangleColor	= tcu::RGBA(127, 127, 127, 255);
		bool			overdraw		= false;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying result." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// color values are greater than triangle color? Allow lower values for multisampled edges and background.
			if ((color.getRed()   - triangleColor.getRed())   > thresholdRed   ||
				(color.getGreen() - triangleColor.getGreen()) > thresholdGreen ||
				(color.getBlue()  - triangleColor.getBlue())  > thresholdBlue)
				overdraw = true;
		}

		// results
		if (!overdraw)
			m_testCtx.getLog() << tcu::TestLog::Message << "No overlapping fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Overlapping fragments detected, image is not valid." << tcu::TestLog::EndMessage;
			m_testCtx.getLog()	<< tcu::TestLog::ImageSet("Result of rendering", "Result of rendering")
								<< tcu::TestLog::Image("Result", "Result", resultImage)
								<< tcu::TestLog::EndImageSet;

			imageShown = true;
			m_allIterationsPassed = false;
		}
	}

	// verify no missing fragments in the full viewport case
	if (m_caseType == FILLRULECASE_CLIPPED_FULL)
	{
		bool missingFragments = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "Searching missing fragments." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// black? (background)
			if (color.getRed()   <= thresholdRed   ||
				color.getGreen() <= thresholdGreen ||
				color.getBlue()  <= thresholdBlue)
				missingFragments = true;
		}

		// results
		if (!missingFragments)
			m_testCtx.getLog() << tcu::TestLog::Message << "No missing fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Missing fragments detected, image is not valid." << tcu::TestLog::EndMessage;

			if (!imageShown)
			{
				m_testCtx.getLog()	<< tcu::TestLog::ImageSet("Result of rendering", "Result of rendering")
									<< tcu::TestLog::Image("Result", "Result", resultImage)
									<< tcu::TestLog::EndImageSet;
			}

			m_allIterationsPassed = false;
		}
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Found invalid pixels");

		return STOP;
	}
	else
		return CONTINUE;
}